

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestResult
               (ostream *stream,TestResult *result)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *in_RDI;
  string detail_1;
  string summary_1;
  string location_1;
  string detail;
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int skips;
  int failures;
  string *in_stack_fffffffffffffd58;
  TestPartResult *in_stack_fffffffffffffd60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd68;
  TestResult *in_stack_fffffffffffffd70;
  ostream *in_stack_fffffffffffffd80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd98;
  string local_220 [20];
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  string local_200 [32];
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [16];
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [48];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  TestPartResult *local_28;
  int local_1c;
  int local_18;
  int local_14;
  string *local_8;
  
  local_14 = 0;
  local_18 = 0;
  local_8 = in_RDI;
  for (local_1c = 0; iVar3 = local_1c, iVar2 = TestResult::total_part_count((TestResult *)0x12b903),
      iVar3 < iVar2; local_1c = local_1c + 1) {
    local_28 = TestResult::GetTestPartResult
                         (in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20))
    ;
    bVar1 = TestPartResult::failed(in_stack_fffffffffffffd60);
    if (bVar1) {
      local_14 = local_14 + 1;
      if ((local_14 == 1) && (local_18 == 0)) {
        std::operator<<((ostream *)local_8,">\n");
      }
      TestPartResult::file_name(in_stack_fffffffffffffd60);
      TestPartResult::line_number(local_28);
      FormatCompilerIndependentFileLocation_abi_cxx11_
                (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      TestPartResult::summary((TestPartResult *)0x12b9da);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      std::__cxx11::string::~string(local_88);
      poVar4 = std::operator<<((ostream *)local_8,"      <failure message=\"");
      EscapeXmlAttribute(in_stack_fffffffffffffd58);
      poVar4 = std::operator<<(poVar4,local_b8);
      std::operator<<(poVar4,"\" type=\"\">");
      std::__cxx11::string::~string(local_b8);
      std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
      TestPartResult::message((TestPartResult *)0x12baa0);
      std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
      std::__cxx11::string::~string(local_f8);
      RemoveInvalidXmlCharacters(in_stack_fffffffffffffd98);
      std::__cxx11::string::c_str();
      OutputXmlCDataSection((ostream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
      std::__cxx11::string::~string(local_118);
      std::operator<<((ostream *)local_8,"</failure>\n");
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_68);
      std::__cxx11::string::~string(local_48);
    }
    else {
      bVar1 = TestPartResult::skipped(local_28);
      if (bVar1) {
        local_18 = local_18 + 1;
        if ((local_18 == 1) && (local_14 == 0)) {
          std::operator<<((ostream *)local_8,">\n");
        }
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               TestPartResult::file_name(in_stack_fffffffffffffd60);
        TestPartResult::line_number(local_28);
        in_stack_fffffffffffffd98 = (string *)local_138;
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
        std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd88 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             TestPartResult::summary((TestPartResult *)0x12bd0a);
        std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
        std::__cxx11::string::~string(local_178);
        in_stack_fffffffffffffd80 = std::operator<<((ostream *)local_8,"      <skipped message=\"");
        in_stack_fffffffffffffd70 = (TestResult *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffd88,
                   (allocator<char> *)in_stack_fffffffffffffd80);
        EscapeXmlAttribute(in_stack_fffffffffffffd58);
        in_stack_fffffffffffffd68 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(in_stack_fffffffffffffd80,local_198);
        std::operator<<((ostream *)in_stack_fffffffffffffd68,"\">");
        std::__cxx11::string::~string(local_198);
        std::__cxx11::string::~string(local_1b8);
        std::allocator<char>::~allocator(&local_1b9);
        std::operator+(in_stack_fffffffffffffd88,(char *)in_stack_fffffffffffffd80);
        in_stack_fffffffffffffd60 =
             (TestPartResult *)TestPartResult::message((TestPartResult *)0x12be27);
        std::operator+(in_stack_fffffffffffffd68,(char *)in_stack_fffffffffffffd60);
        std::__cxx11::string::~string(local_200);
        in_stack_fffffffffffffd58 = local_8;
        RemoveInvalidXmlCharacters(in_stack_fffffffffffffd98);
        std::__cxx11::string::c_str();
        OutputXmlCDataSection
                  ((ostream *)in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
        std::__cxx11::string::~string(local_220);
        std::operator<<((ostream *)local_8,"</skipped>\n");
        std::__cxx11::string::~string(local_1e0);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_138);
      }
    }
  }
  if (((local_14 == 0) && (local_18 == 0)) &&
     (iVar3 = TestResult::test_property_count((TestResult *)0x12c066), iVar3 == 0)) {
    std::operator<<((ostream *)local_8," />\n");
  }
  else {
    if ((local_14 == 0) && (local_18 == 0)) {
      std::operator<<((ostream *)local_8,">\n");
    }
    OutputXmlTestProperties
              ((ostream *)in_stack_fffffffffffffee0,(TestResult *)in_stack_fffffffffffffed8);
    std::operator<<((ostream *)local_8,"    </testcase>\n");
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestResult(::std::ostream* stream,
                                                   const TestResult& result) {
  int failures = 0;
  int skips = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1 && skips == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\"" << EscapeXmlAttribute(summary)
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    } else if (part.skipped()) {
      if (++skips == 1 && failures == 0) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <skipped message=\""
              << EscapeXmlAttribute(summary.c_str()) << "\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</skipped>\n";
    }
  }

  if (failures == 0 && skips == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0 && skips == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}